

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

Benchmark * __thiscall
benchmark::internal::Benchmark::Ranges
          (Benchmark *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *ranges)

{
  int iVar1;
  CheckHandler CStack_18;
  
  iVar1 = BenchmarkImp::ArgsCnt(this->imp_);
  if (iVar1 != -1) {
    iVar1 = BenchmarkImp::ArgsCnt(this->imp_);
    if (iVar1 != (int)((ulong)(*(long *)(ranges + 8) - *(long *)ranges) >> 3)) {
      CheckHandler::CheckHandler
                (&CStack_18,
                 "imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == static_cast<int>(ranges.size())",
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                 ,"Ranges",0x2b4);
      CheckHandler::~CheckHandler(&CStack_18);
    }
  }
  GetNullLogInstance();
  BenchmarkImp::Ranges(this->imp_,ranges);
  return this;
}

Assistant:

Benchmark* Benchmark::Ranges(const std::vector<std::pair<int, int>>& ranges)
{
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == static_cast<int>(ranges.size()));
  imp_->Ranges(ranges);
  return this;
}